

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

void Abc_NtkRecLibMerge3(Gia_Man_t *pLib)

{
  word *pTruth;
  char cVar1;
  Gia_Man_t *p;
  Lms_Man_t *pLVar2;
  int v;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Str_t *__ptr;
  word *pwVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  long lVar10;
  ulong *puVar11;
  Gia_Obj_t *pGVar12;
  uint uVar13;
  ulong uVar14;
  int SuppSize;
  ulong uVar15;
  timespec ts;
  char pCanonPerm [16];
  timespec local_90;
  Lms_Man_t *local_80;
  ulong local_78;
  ulong *local_70;
  long local_68;
  long local_60;
  Vec_Str_t *local_58;
  long local_50;
  char local_48 [24];
  
  pLVar2 = s_pMan3;
  p = s_pMan3->pGia;
  iVar3 = clock_gettime(3,&local_90);
  if (iVar3 < 0) {
    local_60 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
    local_60 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_90.tv_sec * -1000000;
  }
  if (pLib->vCis->nSize == p->vCis->nSize) {
    local_80 = pLVar2;
    if ((p->vHTable).nSize == 0) {
      Gia_ManHashStart(p);
    }
    __ptr = Lms_GiaSuppSizes(pLib);
    pVVar8 = pLib->vCos;
    if (0 < pVVar8->nSize) {
      pTruth = local_80->pTemp1;
      lVar9 = 0;
      local_58 = __ptr;
      do {
        iVar3 = pVVar8->pArray[lVar9];
        if (((long)iVar3 < 0) || (pLib->nObjs <= iVar3)) goto LAB_002f8e5b;
        pGVar12 = pLib->pObjs;
        __ptr = local_58;
        if (pGVar12 == (Gia_Obj_t *)0x0) break;
        if (local_58->nSize <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        local_78 = (ulong)(uint)(int)local_58->pArray[lVar9];
        local_50 = lVar9;
        if (local_58->pArray[lVar9] < 2) {
          __assert_fail("nLeaves > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x255,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
        }
        iVar4 = clock_gettime(3,&local_90);
        if (iVar4 < 0) {
          lVar9 = 1;
        }
        else {
          lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
          lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_90.tv_sec * -1000000;
        }
        pGVar12 = pGVar12 + iVar3;
        pwVar7 = Gia_ObjComputeTruthTable
                           (pLib,pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff));
        iVar3 = clock_gettime(3,&local_90);
        if (iVar3 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
        }
        local_80->timeTruth = local_80->timeTruth + lVar10 + lVar9;
        iVar3 = clock_gettime(3,&local_90);
        pLVar2 = local_80;
        if (iVar3 < 0) {
          local_68 = 1;
        }
        else {
          lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
          local_68 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_90.tv_sec * -1000000;
        }
        local_70 = pwVar7;
        memcpy(pTruth,pwVar7,(long)local_80->nWords << 3);
        iVar4 = (int)local_78;
        uVar5 = Abc_TtCanonicize(pTruth,iVar4,local_48);
        iVar3 = pLVar2->nVars;
        if (iVar3 != iVar4) {
          if (iVar3 <= iVar4) {
            __assert_fail("nVarS < nVarB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x46e,"void Abc_TtStretch5(unsigned int *, int, int)");
          }
          uVar6 = 1 << ((byte)local_78 - 5 & 0x1f);
          if ((byte)local_78 < 6) {
            uVar6 = 1;
          }
          uVar13 = 1 << ((char)iVar3 - 5U & 0x1f);
          if (iVar3 < 6) {
            uVar13 = 1;
          }
          if (uVar6 != uVar13) {
            if ((int)uVar13 <= (int)uVar6) {
              __assert_fail("step < nWords",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                            ,0x473,"void Abc_TtStretch5(unsigned int *, int, int)");
            }
            if (0 < (int)uVar13) {
              lVar9 = 0;
              pwVar7 = pTruth;
              do {
                if (0 < (int)uVar6) {
                  uVar15 = 0;
                  do {
                    *(undefined4 *)((long)pwVar7 + uVar15 * 4) =
                         *(undefined4 *)((long)pTruth + uVar15 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar6 != uVar15);
                }
                lVar9 = lVar9 + (int)uVar6;
                pwVar7 = (word *)((long)pwVar7 + (long)(int)uVar6 * 4);
              } while (lVar9 < (long)(ulong)uVar13);
            }
          }
        }
        iVar3 = clock_gettime(3,&local_90);
        if (iVar3 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
        }
        local_80->timeCanon = local_80->timeCanon + lVar9 + local_68;
        if ((char)local_78 == '\x02') {
          lVar9 = 0;
          pwVar7 = s_Truths6Neg;
          iVar3 = 0;
          do {
            iVar3 = (iVar3 + 1) -
                    (uint)(((*local_70 >> ((byte)(1 << ((byte)lVar9 & 0x1f)) & 0x3f) ^ *local_70) &
                           *pwVar7) == 0);
            lVar9 = lVar9 + 1;
            pwVar7 = pwVar7 + 1;
          } while (lVar9 != 2);
          if (iVar3 == 2) goto LAB_002f8a5a;
        }
        else {
LAB_002f8a5a:
          iVar3 = clock_gettime(3,&local_90);
          if (iVar3 < 0) {
            puVar11 = (ulong *)0x1;
          }
          else {
            lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
            puVar11 = (ulong *)(((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_90.tv_sec * -1000000);
          }
          pVVar8 = p->vCis;
          uVar6 = pVVar8->nSize;
          uVar13 = uVar6 - p->nRegs;
          uVar15 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar15 = 0;
          }
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          uVar14 = 0;
          do {
            if (uVar15 == uVar14) {
              __assert_fail("v < Gia_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
            }
            if (uVar6 == uVar14) {
LAB_002f8e7a:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar3 = pVVar8->pArray[uVar14];
            if ((iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_002f8e5b;
            cVar1 = local_48[uVar14];
            if ((cVar1 < '\0') || (pLib->vCis->nSize <= (int)cVar1)) goto LAB_002f8e7a;
            iVar4 = pLib->vCis->pArray[(uint)(int)cVar1];
            if (((long)iVar4 < 0) || (pLib->nObjs <= iVar4)) goto LAB_002f8e5b;
            pLib->pObjs[iVar4].Value = (uint)((uVar5 >> ((uint)uVar14 & 0x1f) & 1) != 0) + iVar3 * 2
            ;
            uVar14 = uVar14 + 1;
          } while ((local_78 & 0xffffffff) != uVar14);
          pVVar8 = pLib->vTtNodes;
          local_70 = puVar11;
          if (pVVar8->nSize < 1) {
            __assert_fail("Vec_IntSize(pLib->vTtNodes) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x26e,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
          }
          lVar9 = 0;
          do {
            iVar3 = pVVar8->pArray[lVar9];
            if (((long)iVar3 < 0) || (pLib->nObjs <= iVar3)) goto LAB_002f8e5b;
            if (pLib->pObjs == (Gia_Obj_t *)0x0) {
              pGVar12 = (Gia_Obj_t *)0x0;
              break;
            }
            pGVar12 = pLib->pObjs + iVar3;
            uVar15 = *(ulong *)pGVar12;
            if ((int)pGVar12[-(ulong)((uint)uVar15 & 0x1fffffff)].Value < 0) goto LAB_002f8eb8;
            uVar6 = (uint)(uVar15 >> 0x20);
            if ((int)pGVar12[-(ulong)(uVar6 & 0x1fffffff)].Value < 0) goto LAB_002f8eb8;
            uVar6 = Gia_ManHashAnd(p,(uint)(uVar15 >> 0x1d) & 1 ^
                                     pGVar12[-(ulong)((uint)uVar15 & 0x1fffffff)].Value,
                                   pGVar12[-(ulong)(uVar6 & 0x1fffffff)].Value ^ uVar6 >> 0x1d & 1);
            pGVar12->Value = uVar6;
            lVar9 = lVar9 + 1;
            pVVar8 = pLib->vTtNodes;
          } while (lVar9 < pVVar8->nSize);
          iVar3 = clock_gettime(3,&local_90);
          pLVar2 = local_80;
          if (iVar3 < 0) {
            lVar9 = -1;
          }
          else {
            lVar9 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
          }
          local_80->timeBuild = (long)local_70 + local_80->timeBuild + lVar9;
          if (((int)(uint)*(ulong *)pGVar12 < 0) ||
             (((uint)*(ulong *)pGVar12 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pTemp)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x278,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
          }
          if ((int)pGVar12->Value < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar6 = pGVar12->Value >> 1;
          if (p->nObjs <= (int)uVar6) {
LAB_002f8e5b:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar15 = *(ulong *)(p->pObjs + uVar6);
          if ((uVar15 & 0x4000000000000000) == 0) {
            *(ulong *)(p->pObjs + uVar6) = uVar15 | 0x4000000000000000;
            if ((int)pGVar12->Value < 0) {
LAB_002f8eb8:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            Gia_ManAppendCo(p,pGVar12->Value ^ (uint)((uVar5 >> ((uint)local_78 & 0x1f) & 1) != 0));
            iVar3 = clock_gettime(3,&local_90);
            if (iVar3 < 0) {
              lVar9 = 1;
            }
            else {
              lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
              lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_90.tv_sec * -1000000;
            }
            iVar3 = Vec_MemHashInsert(pLVar2->vTtMem,pTruth);
            Vec_IntPush(pLVar2->vTruthIds,iVar3);
            if (p->vCos->nSize != pLVar2->vTruthIds->nSize) {
              __assert_fail("Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                            ,0x29f,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
            }
            pLVar2->nAdded = pLVar2->nAdded + 1;
            iVar3 = clock_gettime(3,&local_90);
            if (iVar3 < 0) {
              lVar10 = -1;
            }
            else {
              lVar10 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
            }
            pLVar2->timeInsert = pLVar2->timeInsert + lVar10 + lVar9;
          }
          else {
            local_80->nFilterSame = local_80->nFilterSame + 1;
          }
        }
        lVar9 = local_50 + 1;
        pVVar8 = pLib->vCos;
        __ptr = local_58;
      } while (lVar9 < pVVar8->nSize);
    }
    if (__ptr->pArray != (char *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    iVar3 = clock_gettime(3,&local_90);
    if (iVar3 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
    }
    local_80->timeTotal = local_80->timeTotal + lVar9 + local_60;
  }
  else {
    printf("The number of Library inputs (%d) differs from the number of Gia inputs (%d).\n");
  }
  return;
}

Assistant:

void Abc_NtkRecLibMerge3( Gia_Man_t * pLib )
{
    int fCheck = 0;
    Lms_Man_t * p = s_pMan3;
    Gia_Man_t * pGia = p->pGia;
    Vec_Str_t * vSupps;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    word * pTruth;
    int i, k, Index, iFanin0, iFanin1, nLeaves;
    Gia_Obj_t * pObjPo, * pDriver, * pTemp = NULL;
    abctime clk, clk2 = Abc_Clock();

    if ( Gia_ManCiNum(pLib) != Gia_ManCiNum(pGia) )
    {
        printf( "The number of Library inputs (%d) differs from the number of Gia inputs (%d).\n", Gia_ManCiNum(pLib), Gia_ManCiNum(pGia) );
        return;
    }
    assert( Gia_ManCiNum(pLib) == Gia_ManCiNum(pGia) );

    // create hash table if not available
    if ( Vec_IntSize(&pGia->vHTable) == 0 )
        Gia_ManHashStart( pGia );

    // add AIG subgraphs
    vSupps = Lms_GiaSuppSizes( pLib );
    Gia_ManForEachCo( pLib, pObjPo, k )
    {
        // get support size
        nLeaves = Vec_StrEntry(vSupps, k);
        assert( nLeaves > 1 );

        // compute the truth table
clk = Abc_Clock();
        pTruth = Gia_ObjComputeTruthTable( pLib, Gia_ObjFanin0(pObjPo) );
p->timeTruth += Abc_Clock() - clk;
        // semi-canonicize
clk = Abc_Clock();
        memcpy( p->pTemp1, pTruth, p->nWords * sizeof(word) );
#ifdef LMS_USE_OLD_FORM
        uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pTemp1, (unsigned *)p->pTemp2, nLeaves, pCanonPerm );
#else
        uCanonPhase = Abc_TtCanonicize( p->pTemp1, nLeaves, pCanonPerm );
#endif
        Abc_TtStretch5( (unsigned *)p->pTemp1, nLeaves, p->nVars );
p->timeCanon += Abc_Clock() - clk;
        // pCanonPerm and uCanonPhase show what was the variable corresponding to each var in the current truth
        if ( nLeaves == 2 && Abc_TtSupportSize(pTruth, 2) != 2 )
            continue;

clk = Abc_Clock();
        // map cut leaves into elementary variables of GIA
        for ( i = 0; i < nLeaves; i++ )
            Gia_ManCi( pLib, pCanonPerm[i] )->Value = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManPi(pGia, i)), (uCanonPhase >> i) & 1 );
        // build internal nodes
        assert( Vec_IntSize(pLib->vTtNodes) > 0 );
        Gia_ManForEachObjVec( pLib->vTtNodes, pLib, pTemp, i )
        {
            iFanin0 = Abc_LitNotCond( Gia_ObjFanin0(pTemp)->Value, Gia_ObjFaninC0(pTemp) );
            iFanin1 = Abc_LitNotCond( Gia_ObjFanin1(pTemp)->Value, Gia_ObjFaninC1(pTemp) );
            pTemp->Value = Gia_ManHashAnd( pGia, iFanin0, iFanin1 );
        }
p->timeBuild += Abc_Clock() - clk;

        // check if this node is already driving a PO
        assert( Gia_ObjIsAnd(pTemp) );
        pDriver = Gia_ManObj(pGia, Abc_Lit2Var(pTemp->Value));
        if ( pDriver->fMark1 )
        {
            p->nFilterSame++;
            continue;
        }
        pDriver->fMark1 = 1;
        // create output
        Gia_ManAppendCo( pGia, Abc_LitNotCond( pTemp->Value, (uCanonPhase >> nLeaves) & 1 ) );

        // verify truth table
        if ( fCheck )
        {
clk = Abc_Clock();
        pTemp = Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1);
        pTruth = Gia_ObjComputeTruthTable( pGia, Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1) );
p->timeCheck += Abc_Clock() - clk;
        if ( memcmp( p->pTemp1, pTruth, p->nWords * sizeof(word) ) != 0 )
        {
    
            Kit_DsdPrintFromTruth( (unsigned *)pTruth, nLeaves ); printf( "\n" );
            Kit_DsdPrintFromTruth( (unsigned *)p->pTemp1, nLeaves ); printf( "\n" );
            printf( "Truth table verification has failed.\n" );
    
            // drive PO with constant
            Gia_ManPatchCoDriver( pGia, Gia_ManCoNum(pGia)-1, 0 );
            // save truth table ID
            Vec_IntPush( p->vTruthIds, -1 );
            p->nFilterTruth++;
            continue;
        }
        }

clk = Abc_Clock();
        // add the resulting truth table to the hash table 
        Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
        // save truth table ID
        Vec_IntPush( p->vTruthIds, Index );
        assert( Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds) );
        p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
    }
    Vec_StrFree( vSupps );
p->timeTotal += Abc_Clock() - clk2;
}